

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::iterator::iterator(iterator *this,iterator *param_1)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  (this->_iter)._M_current = (param_1->_iter)._M_current;
  pcVar1 = (param_1->_first)._M_current;
  pcVar2 = (param_1->_last)._M_current;
  pcVar3 = (param_1->_root)._M_current;
  (this->_prefix)._M_current = (param_1->_prefix)._M_current;
  (this->_root)._M_current = pcVar3;
  (this->_first)._M_current = pcVar1;
  (this->_last)._M_current = pcVar2;
  std::__cxx11::string::string((string *)&this->_current,(string *)&param_1->_current);
  return;
}

Assistant:

class GHC_FS_API_CLASS path::iterator
{
public:
    using value_type = const path;
    using difference_type = std::ptrdiff_t;
    using pointer = const path*;
    using reference = const path&;
    using iterator_category = std::bidirectional_iterator_tag;

    iterator();
    iterator(const path& p, const impl_string_type::const_iterator& pos);
    iterator& operator++();
    iterator operator++(int);
    iterator& operator--();
    iterator operator--(int);
    bool operator==(const iterator& other) const;
    bool operator!=(const iterator& other) const;
    reference operator*() const;
    pointer operator->() const;

private:
    friend class path;
    impl_string_type::const_iterator increment(const impl_string_type::const_iterator& pos) const;
    impl_string_type::const_iterator decrement(const impl_string_type::const_iterator& pos) const;
    void updateCurrent();
    impl_string_type::const_iterator _first;
    impl_string_type::const_iterator _last;
    impl_string_type::const_iterator _prefix;
    impl_string_type::const_iterator _root;
    impl_string_type::const_iterator _iter;
    path _current;
}